

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O1

int read_line(lua_State *L,FILE *f,int chop)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  lua_Unsigned lVar4;
  ulong uVar5;
  luaL_Buffer b;
  luaL_Buffer local_450;
  
  luaL_buffinit(L,&local_450);
  do {
    pcVar3 = luaL_prepbuffsize(&local_450,0x400);
    uVar5 = 0;
    do {
      iVar1 = getc((FILE *)f);
      if ((iVar1 == -1) || (iVar1 == 10)) goto LAB_0012bc18;
      pcVar3[uVar5] = (char)iVar1;
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x400);
    uVar5 = 0x400;
LAB_0012bc18:
    local_450.n = (uVar5 & 0xffffffff) + local_450.n;
    if ((iVar1 == 10) || (iVar1 == -1)) {
      if (chop == 0 && iVar1 == 10) {
        if (local_450.size <= local_450.n) {
          luaL_prepbuffsize(&local_450,1);
        }
        local_450.b[local_450.n] = '\n';
        local_450.n = local_450.n + 1;
      }
      luaL_pushresult(&local_450);
      uVar2 = 1;
      if (iVar1 != 10) {
        lVar4 = lua_rawlen(L,-1);
        uVar2 = (uint)(lVar4 != 0);
      }
      return uVar2;
    }
  } while( true );
}

Assistant:

static int read_line (lua_State *L, FILE *f, int chop) {
  luaL_Buffer b;
  int c;
  luaL_buffinit(L, &b);
  do {  /* may need to read several chunks to get whole line */
    char *buff = luaL_prepbuffer(&b);  /* preallocate buffer space */
    int i = 0;
    l_lockfile(f);  /* no memory errors can happen inside the lock */
    while (i < LUAL_BUFFERSIZE && (c = l_getc(f)) != EOF && c != '\n')
      buff[i++] = c;  /* read up to end of line or buffer limit */
    l_unlockfile(f);
    luaL_addsize(&b, i);
  } while (c != EOF && c != '\n');  /* repeat until end of line */
  if (!chop && c == '\n')  /* want a newline and have one? */
    luaL_addchar(&b, c);  /* add ending newline to result */
  luaL_pushresult(&b);  /* close buffer */
  /* return ok if read something (either a newline or something else) */
  return (c == '\n' || lua_rawlen(L, -1) > 0);
}